

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall Fl_Text_Buffer::rewind_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (1 < startPos) {
    iVar1 = this->mGapStart;
    uVar6 = startPos - 1;
    iVar3 = -1;
    if (iVar1 < startPos) {
      uVar4 = (ulong)(uint)startPos;
      iVar3 = -1;
      do {
        if (this->mBuf[uVar4 + (long)(this->mGapEnd - iVar1) + -1] == '\n') {
          iVar3 = iVar3 + 1;
          if (nLines <= iVar3) goto LAB_001d0245;
        }
        uVar4 = uVar4 - 1;
        uVar6 = uVar6 - 1;
      } while ((long)iVar1 < (long)uVar4);
    }
    if (-1 < (int)uVar6) {
      uVar4 = (ulong)uVar6 + 1;
      do {
        if (this->mBuf[uVar4 - 1] == '\n') {
          iVar3 = iVar3 + 1;
          if (nLines <= iVar3) {
LAB_001d0245:
            return (int)uVar4;
          }
        }
        uVar5 = uVar4 - 1;
        bVar2 = 0 < (long)uVar4;
        uVar4 = uVar5;
      } while (uVar5 != 0 && bVar2);
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::rewind_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  int pos = startPos - 1;
  if (pos <= 0)
    return 0;
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = -1;
  while (pos >= mGapStart) {
    if (mBuf[pos + gapLen] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  while (pos >= 0) {
    if (mBuf[pos] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  return 0;
}